

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  ParsedIR *this_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_01;
  Types TVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  uint *puVar4;
  Variant *pVVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  uint32_t uVar12;
  ExecutionModel EVar13;
  SPIREntryPoint *pSVar14;
  SPIRConstant *constant;
  SPIRConstantOp *constant_00;
  SPIRType *pSVar15;
  SPIRVariable *pSVar16;
  mapped_type *pmVar17;
  ulong uVar18;
  runtime_error *this_02;
  Variant *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_00;
  StorageClass SVar19;
  uint uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  uint32_t *puVar21;
  ID *__k;
  byte bVar22;
  uint32_t *puVar23;
  long lVar24;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  LoopLock loop_lock;
  char *storage;
  SpecializationConstant local_1288;
  SpecializationConstant local_1280;
  string local_1278;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1258;
  SpecializationConstant local_1250;
  undefined1 local_1248 [24];
  uint32_t local_1230 [66];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  pSVar14 = Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x39])(this);
  if (pSVar14->model == ExecutionModelFragment) {
    uVar11 = 0x81;
    if ((this->options).es != false) {
      uVar11 = 299;
    }
    if ((this->options).version <= uVar11) {
      replace_fragment_outputs(this);
    }
  }
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    emit_pls(this);
  }
  EVar13 = pSVar14->model;
  if ((EVar13 - ExecutionModelTessellationControl < 3) || (EVar13 == ExecutionModelMeshEXT)) {
    fixup_implicit_builtin_block_names(this,EVar13);
  }
  if (((this->options).separate_shader_objects == true) && ((this->options).es == false)) {
    EVar13 = pSVar14->model;
    if ((int)EVar13 < 4) {
      if (EVar13 - ExecutionModelTessellationControl < 3) {
        emit_declared_builtin_block(this,StorageClassInput,EVar13);
        goto LAB_001cfe34;
      }
      if (EVar13 != ExecutionModelVertex) goto LAB_001cfe48;
    }
    else {
      if (EVar13 == ExecutionModelFragment) goto LAB_001cfddb;
      if (EVar13 != ExecutionModelMeshEXT) goto LAB_001cfe48;
    }
    SVar19 = StorageClassOutput;
  }
  else {
LAB_001cfddb:
    bVar7 = should_force_emit_builtin_block(this,StorageClassOutput);
    if (bVar7) {
LAB_001cfe34:
      EVar13 = pSVar14->model;
      SVar19 = StorageClassOutput;
    }
    else {
      if (pSVar14->geometry_passthrough != true) {
        local_1128._0_8_ = "--pls-out";
        if (pSVar14->model == ExecutionModelFragment) {
          local_1128._0_8_ = "--pls-in";
        }
        local_1128._0_8_ = local_1128._0_8_ + 6;
        puVar21 = &(this->super_Compiler).clip_distance_count;
        if ((this->super_Compiler).clip_distance_count != 0) {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,(char **)local_1128,(char (*) [24])0x343350,puVar21,(char (*) [3])0x34ae56
                    );
        }
        puVar23 = &(this->super_Compiler).cull_distance_count;
        if ((this->super_Compiler).cull_distance_count != 0) {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,(char **)local_1128,(char (*) [24])0x343369,puVar23,(char (*) [3])0x34ae56
                    );
        }
        if (*puVar23 != 0 || *puVar21 != 0) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x33ead6);
        }
        goto LAB_001cfe48;
      }
      EVar13 = pSVar14->model;
      SVar19 = StorageClassInput;
    }
  }
  emit_declared_builtin_block(this,SVar19,EVar13);
LAB_001cfe48:
  if ((this->super_Compiler).position_invariant == true) {
    statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
    statement<char_const(&)[1]>(this,(char (*) [1])0x33ead6);
  }
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->super_Compiler).ir.ids_for_constant_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1248);
  }
  else {
    pTVar3 = (this->super_Compiler).ir.ids_for_constant_or_type.
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar24 = 0;
    bVar7 = false;
    do {
      ts_1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      pVVar5 = ts_1 + *(uint *)((long)&pTVar3->id + lVar24);
      TVar1 = pVVar5->type;
      if (TVar1 == TypeType) {
        pSVar15 = Variant::get<spirv_cross::SPIRType>(pVVar5);
        bVar8 = false;
        if ((*(int *)&(pSVar15->super_IVariant).field_0xc == 0xf) &&
           ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
          if ((pSVar15->pointer != false) ||
             (bVar8 = Compiler::has_decoration
                                (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,
                                 DecorationBlock), bVar8)) {
            bVar8 = false;
          }
          else {
            bVar8 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,
                               DecorationBufferBlock);
            bVar8 = !bVar8;
          }
        }
        if ((((*(int *)&(pSVar15->super_IVariant).field_0xc == 0xf) && (pSVar15->pointer == true))
            && (bVar9 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,
                                   DecorationBlock), bVar9)) &&
           ((uVar11 = pSVar15->storage - StorageClassRayPayloadKHR, uVar11 < 5 &&
            ((0x13U >> (uVar11 & 0x1f) & 1) != 0)))) {
          pSVar15 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + (pSVar15->parent_type).id);
          bVar8 = true;
        }
        if (bVar8) {
          if (bVar7) {
            statement<char_const(&)[1]>(this,(char (*) [1])0x33ead6);
          }
          emit_struct(this,pSVar15);
          bVar7 = false;
        }
      }
      else if (TVar1 == TypeConstantOp) {
        constant_00 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar5);
        bVar7 = true;
        emit_specialization_constant_op(this,constant_00);
      }
      else if (TVar1 == TypeConstant) {
        constant = Variant::get<spirv_cross::SPIRConstant>(pVVar5);
        if ((constant->specialization != false) || ((constant->is_used_as_lut & 1U) != 0)) {
          if ((constant->specialization != false) && ((this->options).vulkan_semantics == false)) {
            local_1278._M_dataplus._M_p._0_4_ =
                 Compiler::get_decoration
                           (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,
                            DecorationSpecId);
            join<char_const(&)[25],unsigned_int&>
                      ((string *)local_1128,(spirv_cross *)"SPIRV_CROSS_CONSTANT_ID_",
                       (char (*) [25])&local_1278,(uint *)ts_1);
            ::std::__cxx11::string::operator=
                      ((string *)&constant->specialization_constant_macro_name,(string *)local_1128)
            ;
            if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
              operator_delete((void *)local_1128._0_8_);
            }
          }
          bVar7 = true;
          emit_constant(this,constant);
        }
      }
      lVar24 = lVar24 + 4;
    } while (sVar2 << 2 != lVar24);
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1248);
    if (bVar7) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x33ead6);
    }
  }
  if (((pSVar14->model == ExecutionModelGLCompute) && ((this->options).vulkan_semantics == false))
     && (((pSVar14->workgroup_size).constant != 0 || (((pSVar14->flags).lower & 0x4000000000) != 0))
        )) {
    local_1250.id.id = 0;
    local_1280.id.id = 0;
    local_1288.id.id = 0;
    Compiler::get_work_group_size_specialization_constants
              (&this->super_Compiler,&local_1250,&local_1280,&local_1288);
    if (((local_1250.id.id != 0) || (local_1280.id.id != 0)) || (local_1288.id.id != 0)) {
      local_1248._0_8_ = local_1230;
      local_1248._8_8_ = 0;
      local_1248._16_8_ = 8;
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1248,&local_1250,&local_1280,&local_1288);
      local_110 = local_f8;
      local_1128._0_8_ = (char *)0x0;
      local_1128._8_8_ = 0;
      local_1128._16_8_ = 0;
      sStack_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1248._8_8_ != 0) {
        puVar23 = (uint32_t *)(local_1248._0_8_ + local_1248._8_8_ * 0x20);
        puVar21 = (uint32_t *)local_1248._0_8_;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,*(char **)puVar21,
                     *(size_t *)(puVar21 + 2));
          if (puVar21 != (uint32_t *)(local_1248._0_8_ + local_1248._8_8_ * 0x20 + -0x20)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          puVar21 = puVar21 + 8;
        } while (puVar21 != puVar23);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1278,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",&local_1278,(char (*) [6])0x3417f6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1278._M_dataplus._M_p._4_4_,(uint32_t)local_1278._M_dataplus._M_p) !=
          &local_1278.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1278._M_dataplus._M_p._4_4_,
                                 (uint32_t)local_1278._M_dataplus._M_p));
      }
      statement<char_const(&)[1]>(this,(char (*) [1])0x33ead6);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1248);
    }
  }
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    sVar2 = (this->super_Compiler).physical_storage_non_block_pointer_types.
            super_VectorView<unsigned_int>.buffer_size;
    if (sVar2 != 0) {
      puVar4 = (this->super_Compiler).physical_storage_non_block_pointer_types.
               super_VectorView<unsigned_int>.ptr;
      lVar24 = 0;
      do {
        emit_buffer_reference_block(this,*(uint32_t *)((long)puVar4 + lVar24),false);
        lVar24 = lVar24 + 4;
      } while (sVar2 << 2 != lVar24);
    }
    ParsedIR::create_loop_hard_lock(this_00);
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 != 0) {
      pTVar3 = (this->super_Compiler).ir.ids_for_type[1].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar24 = 0;
      do {
        uVar11 = *(uint *)((long)&pTVar3->id + lVar24);
        pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (((pVVar5[uVar11].type == TypeType) &&
            (pSVar15 = Variant::get<spirv_cross::SPIRType>(pVVar5 + uVar11),
            *(int *)&(pSVar15->super_IVariant).field_0xc == 0xf)) &&
           ((pSVar15->pointer == true &&
            ((pSVar15->pointer_depth == 1 &&
             (bVar7 = Compiler::type_is_array_of_pointers(&this->super_Compiler,pSVar15),
             !bVar7 && pSVar15->storage == StorageClassPhysicalStorageBuffer)))))) {
          emit_buffer_reference_block(this,uVar11,true);
        }
        lVar24 = lVar24 + 4;
      } while (sVar2 << 2 != lVar24);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
    ParsedIR::create_loop_hard_lock(this_00);
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 != 0) {
      pTVar3 = (this->super_Compiler).ir.ids_for_type[1].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar24 = 0;
      do {
        uVar11 = *(uint *)((long)&pTVar3->id + lVar24);
        pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if ((((pVVar5[uVar11].type == TypeType) &&
             (pSVar15 = Variant::get<spirv_cross::SPIRType>(pVVar5 + uVar11),
             *(int *)&(pSVar15->super_IVariant).field_0xc == 0xf)) && (pSVar15->pointer == true)) &&
           ((pSVar15->pointer_depth == 1 &&
            (bVar7 = Compiler::type_is_array_of_pointers(&this->super_Compiler,pSVar15),
            !bVar7 && pSVar15->storage == StorageClassPhysicalStorageBuffer)))) {
          emit_buffer_reference_block(this,uVar11,false);
        }
        lVar24 = lVar24 + 4;
      } while (sVar2 << 2 != lVar24);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  }
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    this_01 = &(this->super_Compiler).ir.meta;
    lVar24 = 0;
    do {
      uVar11 = *(uint *)((long)&pTVar3->id + lVar24);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar16 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar16->super_IVariant).field_0xc);
        SVar19 = pSVar15->storage;
        bVar22 = 1;
        if (((SVar19 != StorageClassUniform) && (SVar19 != StorageClassStorageBuffer)) &&
           (SVar19 != StorageClassShaderRecordBufferKHR)) {
          bVar22 = 0;
        }
        __k = &(pSVar15->super_IVariant).self;
        pmVar17 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,__k);
        if (((pmVar17->decoration).decoration_flags.lower & 4) == 0) {
          pmVar17 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,__k);
          bVar7 = ((pmVar17->decoration).decoration_flags.lower & 8) == 0;
        }
        else {
          bVar7 = false;
        }
        if (((pSVar16->storage != StorageClassFunction) && ((bVar22 & pSVar15->pointer) != 0)) &&
           (bVar8 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false),
           !bVar7 && !bVar8)) {
          (*(this->super_Compiler)._vptr_Compiler[0x20])(this,pSVar16);
        }
      }
      lVar24 = lVar24 + 4;
    } while (sVar2 << 2 != lVar24);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar24 = 0;
    do {
      uVar11 = *(uint *)((long)&pTVar3->id + lVar24);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar16 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar16->super_IVariant).field_0xc);
        if (((pSVar16->storage != StorageClassFunction) && (pSVar15->pointer == true)) &&
           ((pSVar15->storage == StorageClassPushConstant &&
            (bVar7 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false), !bVar7)))) {
          (*(this->super_Compiler)._vptr_Compiler[0x21])(this,pSVar16);
        }
      }
      lVar24 = lVar24 + 4;
    } while (sVar2 << 2 != lVar24);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  sVar2 = (this->super_Compiler).combined_image_samplers.
          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
  bVar7 = (this->options).vulkan_semantics;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar6 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar6 == 0) {
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  }
  else {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar24 = 0;
    bVar8 = false;
    do {
      uVar11 = *(uint *)((long)&pTVar3->id + lVar24);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar16 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar16->super_IVariant).field_0xc);
        if ((((sVar2 == 0 & bVar7) != 0) ||
            (uVar11 = *(uint *)&(pSVar15->super_IVariant).field_0xc, uVar20 = uVar11 ^ 0x10,
            (pSVar15->image).dim == DimBuffer && uVar20 == 0 ||
            uVar11 != 0x12 && ((pSVar15->image).sampled != 1 || uVar20 != 0))) &&
           ((pSVar16->storage != StorageClassFunction && (pSVar15->pointer == true)))) {
          SVar19 = pSVar15->storage;
          if (((((SVar19 - StorageClassCallableDataKHR < 0xf) &&
                ((0x4c03U >> (SVar19 - StorageClassCallableDataKHR & 0x1f) & 1) != 0)) ||
               (SVar19 == StorageClassAtomicCounter)) || (SVar19 == StorageClassUniformConstant)) &&
             (bVar9 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false), !bVar9)) {
            bVar8 = true;
            (*(this->super_Compiler)._vptr_Compiler[0x22])(this,pSVar16);
          }
        }
      }
      lVar24 = lVar24 + 4;
    } while (sVar6 << 2 != lVar24);
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
    if (bVar8) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x33ead6);
    }
  }
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    bVar7 = false;
  }
  else {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar24 = 0;
    bVar8 = false;
    bVar7 = false;
    do {
      uVar11 = *(uint *)((long)&pTVar3->id + lVar24);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar16 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar16->super_IVariant).field_0xc);
        bVar9 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false);
        if (pSVar16->storage == StorageClassOutput) {
          uVar11 = 0x81;
          if ((this->options).es != false) {
            uVar11 = 299;
          }
          if (uVar11 < (this->options).version) {
            uVar12 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar16->super_IVariant).self.id,
                                DecorationLocation);
            bVar10 = location_is_framebuffer_fetch(this,uVar12);
            bVar9 = bVar9 && !bVar10;
          }
        }
        if (((pSVar16->storage == StorageClassFunction) || (pSVar15->pointer != true)) ||
           (((pSVar16->storage | StorageClassUniform) != StorageClassOutput ||
            (bVar10 = Compiler::interface_variable_exists_in_entry_point
                                (&this->super_Compiler,(pSVar16->super_IVariant).self.id),
            bVar9 != false || !bVar10)))) {
          bVar9 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar16);
          if ((bVar9) &&
             (uVar12 = Compiler::get_decoration
                                 (&this->super_Compiler,(ID)(pSVar16->super_IVariant).self.id,
                                  DecorationBuiltIn), (this->options).vulkan_semantics == false)) {
            if ((bVar8) ||
               ((uVar12 != 0x1149 &&
                ((uVar12 == 0x2b & (this->options).vertex.support_nonzero_base_instance) == 0)))) {
              if (uVar12 == 0x114a) {
                statement<char_const(&)[38]>
                          (this,(char (*) [38])"#ifndef GL_ARB_shader_draw_parameters");
                statement<char_const(&)[55]>
                          (this,(char (*) [55])
                                "#error GL_ARB_shader_draw_parameters is not supported.");
              }
              else {
                if (uVar12 != 0x1148) goto LAB_001d096c;
                statement<char_const(&)[37]>
                          (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
                statement<char_const(&)[48]>
                          (this,(char (*) [48])"#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
                statement<char_const(&)[6]>(this,(char (*) [6])"#else");
                statement<char_const(&)[36]>
                          (this,(char (*) [36])"uniform int SPIRV_Cross_BaseVertex;");
              }
              statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
            }
            else {
              statement<char_const(&)[37]>
                        (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[52]>
                        (this,(char (*) [52])"#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
              statement<char_const(&)[6]>(this,(char (*) [6])"#else");
              statement<char_const(&)[38]>
                        (this,(char (*) [38])"uniform int SPIRV_Cross_BaseInstance;");
              bVar8 = true;
              statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
              bVar7 = true;
            }
          }
        }
        else {
          if ((((this->options).es == true) &&
              (EVar13 = Compiler::get_execution_model(&this->super_Compiler),
              EVar13 == ExecutionModelVertex)) &&
             ((pSVar16->storage == StorageClassInput &&
              ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 1)))) {
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1128._0_8_ = local_1128 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1128,
                       "OpenGL ES doesn\'t support array input variables in vertex shader.","");
            ::std::runtime_error::runtime_error(this_02,(string *)local_1128);
            *(undefined ***)this_02 = &PTR__runtime_error_003d7e38;
            __cxa_throw(this_02,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar7 = true;
          emit_interface_block(this,pSVar16);
        }
      }
LAB_001d096c:
      lVar24 = lVar24 + 4;
    } while (sVar2 << 2 != lVar24);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1248);
  sVar2 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
  if (sVar2 != 0) {
    puVar4 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
    local_1258 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    lVar24 = 0;
    do {
      pSVar16 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + *(uint *)((long)puVar4 + lVar24));
      bVar8 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,true);
      if (!bVar8) {
        if (pSVar16->storage == StorageClassOutput) {
          uVar18 = (ulong)(pSVar16->initializer).id;
          if (((uVar18 != 0) &&
              (uVar18 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                        buffer_size)) &&
             (pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar5[uVar18].type == TypeConstant)) {
            Variant::get<spirv_cross::SPIRConstant>(pVVar5 + uVar18);
            emit_output_variable_initializer(this,pSVar16);
          }
        }
        else {
          bVar8 = variable_is_lut(this,pSVar16);
          if (!bVar8) {
            local_1128._0_4_ = (pSVar16->super_IVariant).self.id;
            pmVar17 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_1258,(key_type *)local_1128);
            add_variable(this,&this->resource_names,&this->block_names,(string *)pmVar17);
            local_1128._0_8_ = local_1128 + 0x10;
            local_1128._8_8_ = 0;
            local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
            if (((((this->options).force_zero_initialized_variables == true) &&
                 (pSVar16->storage == StorageClassPrivate)) && ((pSVar16->initializer).id == 0)) &&
               ((pSVar16->static_expression).id == 0)) {
              pSVar15 = Compiler::get_variable_data_type(&this->super_Compiler,pSVar16);
              bVar7 = type_can_zero_initialize(this,pSVar15);
              if (bVar7) {
                uVar12 = Compiler::get_variable_data_type_id(&this->super_Compiler,pSVar16);
                ts_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (this->super_Compiler)._vptr_Compiler;
                (**(code **)((long)&ts_1_00[0xd].field_2 + 8))(&local_1278,this,uVar12);
                join<char_const(&)[4],std::__cxx11::string>
                          ((string *)local_1248,(spirv_cross *)0x35ef26,(char (*) [4])&local_1278,
                           ts_1_00);
                ::std::__cxx11::string::operator=((string *)local_1128,(string *)local_1248);
                if ((undefined1 *)local_1248._0_8_ != local_1248 + 0x10) {
                  operator_delete((void *)local_1248._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1278._M_dataplus._M_p._4_4_,
                                (uint32_t)local_1278._M_dataplus._M_p) != &local_1278.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_1278._M_dataplus._M_p._4_4_,
                                           (uint32_t)local_1278._M_dataplus._M_p));
                }
              }
            }
            (*(this->super_Compiler)._vptr_Compiler[0x26])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1248,this,pSVar16);
            statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1128,(char (*) [2])0x347553);
            if ((undefined1 *)local_1248._0_8_ != local_1248 + 0x10) {
              operator_delete((void *)local_1248._0_8_);
            }
            if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
              operator_delete((void *)local_1128._0_8_);
            }
            bVar7 = true;
          }
        }
      }
      lVar24 = lVar24 + 4;
    } while (sVar2 << 2 != lVar24);
  }
  if (bVar7) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x33ead6);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x3b])(this);
  return;
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (position_invariant)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_or_type)
		{
			auto &id = ir.ids[id_];

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		for (auto type : physical_storage_non_block_pointer_types)
		{
			emit_buffer_reference_block(type, false);
		}

		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct && type.pointer &&
			    type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, true);
			}
		});

		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct &&
			    type.pointer && type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, false);
			}
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");

	declare_undefined_values();
}